

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepLoop.h
# Opt level: O2

void anurbs::BrepLoop::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *pcVar1;
  string name;
  class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> local_b0;
  char *local_a8 [4];
  arg local_88;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_>::class_<>
            (&local_b0,(m->super_object).super_handle.m_ptr,local_a8[0]);
  local_28 = brep;
  local_20 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<anurbs::Ref<anurbs::Brep>(anurbs::BrepLoop::*)()const>
                     ((class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)&local_b0,"brep"
                      ,(offset_in_Model_to_subr *)&local_28);
  local_38 = edges;
  local_30 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>(anurbs::BrepLoop::*)()const>
                     (pcVar1,"edges",(offset_in_Model_to_subr *)&local_38);
  local_48 = face;
  local_40 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepFace>(anurbs::BrepLoop::*)()const>
                     (pcVar1,"face",(offset_in_Model_to_subr *)&local_48);
  local_58 = nb_trims;
  local_50 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<unsigned_long(anurbs::BrepLoop::*)()const>
                     (pcVar1,"nb_trims",(offset_in_Model_to_subr *)&local_58);
  local_68 = trims;
  local_60 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepTrim>,std::allocator<anurbs::Ref<anurbs::BrepTrim>>>(anurbs::BrepLoop::*)()const>
                     (pcVar1,"trims",(offset_in_Model_to_subr *)&local_68);
  local_78 = trim;
  local_70 = 0;
  local_88.name = "index";
  local_88._8_1_ = 2;
  pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
  def<anurbs::Ref<anurbs::BrepTrim>(anurbs::BrepLoop::*)(unsigned_long)const,pybind11::arg>
            (pcVar1,"trim",(offset_in_Model_to_subr *)&local_78,&local_88);
  pybind11::object::~object((object *)&local_b0);
  Model::register_python_data_type<anurbs::BrepLoop>(m,model);
  std::__cxx11::string::~string((string *)local_a8);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepLoop;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("brep", &Type::brep)
            .def_property_readonly("edges", &Type::edges)
            .def_property_readonly("face", &Type::face)
            .def_property_readonly("nb_trims", &Type::nb_trims)
            .def_property_readonly("trims", &Type::trims)
            // methods
            .def("trim", &Type::trim, "index"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }